

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

cli_option * cli_get_option(char *name,ll_node *parsed)

{
  ll_node *plVar1;
  ll_node *result;
  ll_node *parsed_local;
  char *name_local;
  
  if (parsed == (ll_node *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    g_cli_get_option_name = name;
    plVar1 = ll_find(parsed,cli_get_option_predicate);
    if (plVar1 == (ll_node *)0x0) {
      name_local = (char *)0x0;
    }
    else {
      name_local = (char *)plVar1->value_ptr;
    }
  }
  return (cli_option *)name_local;
}

Assistant:

const struct cli_option *cli_get_option(char *name, struct ll_node *parsed)
{
	if (parsed == NULL) {
		return NULL;
	}
	g_cli_get_option_name = name;
	struct ll_node *result = ll_find(parsed, &cli_get_option_predicate);
	if (result == NULL) {
		return NULL;
	}
	return result->value_ptr;
}